

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::
str<kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::String,kj::String,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,Type *params,char **params_1,StringPtr *params_2,
          char **params_3,String *params_4,String *params_5,char (*params_6) [2])

{
  char *pcVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff58;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_60 = (ArrayPtr<const_char>)toCharSequence<kj::Exception::Type>((Type *)this);
  local_70 = toCharSequence<char_const*>((char **)params);
  local_80.ptr = *params_1;
  local_80.size_ = (size_t)(params_1[1] + -1);
  local_90 = toCharSequence<char_const*>((char **)params_2);
  pcVar1 = params_3[1];
  local_a0.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_a0.ptr = *params_3;
  }
  local_a0.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_a0.size_ = (size_t)(char *)0x0;
  }
  pcVar1 = (char *)(params_4->content).size_;
  local_40.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_40.ptr = (params_4->content).ptr;
  }
  local_40.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_40.size_ = (size_t)(char *)0x0;
  }
  local_50 = toCharSequence<char_const(&)[2]>((char (*) [2])params_5);
  _::
  concat<kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_60,(StringPtr *)&local_70,&local_80,&local_90,
             &local_a0,&local_40,&local_50,in_stack_ffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}